

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uECC.c
# Opt level: O3

int default_RNG(uint8_t *dest,uint size)

{
  int __fd;
  ssize_t sVar1;
  int iVar2;
  size_t __nbytes;
  
  iVar2 = 0;
  __fd = open("/dev/urandom",0x80000);
  if ((__fd != -1) || (__fd = open("/dev/random",0x80000), __fd != -1)) {
    iVar2 = 1;
    if (size != 0) {
      __nbytes = (size_t)size;
      do {
        sVar1 = read(__fd,dest,__nbytes);
        if (sVar1 < 1) {
          iVar2 = 0;
          break;
        }
        dest = dest + sVar1;
        __nbytes = __nbytes - sVar1;
      } while (__nbytes != 0);
    }
    close(__fd);
  }
  return iVar2;
}

Assistant:

static int default_RNG(uint8_t *dest, unsigned size) {
    int fd = open("/dev/urandom", O_RDONLY | O_CLOEXEC);
    if (fd == -1) {
        fd = open("/dev/random", O_RDONLY | O_CLOEXEC);
        if (fd == -1) {
            return 0;
        }
    }

    char *ptr = (char *)dest;
    size_t left = size;
    while (left > 0) {
        ssize_t bytes_read = read(fd, ptr, left);
        if (bytes_read <= 0) { // read failed
            close(fd);
            return 0;
        }
        left -= bytes_read;
        ptr += bytes_read;
    }

    close(fd);
    return 1;
}